

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<Symbol>::growAppend(QCommonArrayOps<Symbol> *this,Symbol *b,Symbol *e)

{
  Symbol *pSVar1;
  Symbol **data;
  QArrayDataPointer<Symbol> *old;
  long in_FS_OFFSET;
  QArrayDataPointer<Symbol> local_38;
  Symbol *local_20;
  long local_18;
  
  old = &local_38;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = b;
  if (b != e) {
    local_38.d = (Data *)0x0;
    local_38.ptr = (Symbol *)0x0;
    local_38.size = 0;
    pSVar1 = (this->super_Type).super_QGenericArrayOps<Symbol>.super_QArrayDataPointer<Symbol>.ptr;
    if ((b < pSVar1) ||
       (pSVar1 + (this->super_Type).super_QGenericArrayOps<Symbol>.super_QArrayDataPointer<Symbol>.
                 size <= b)) {
      data = (Symbol **)0x0;
      old = (QArrayDataPointer<Symbol> *)0x0;
    }
    else {
      data = &local_20;
    }
    QArrayDataPointer<Symbol>::detachAndGrow
              ((QArrayDataPointer<Symbol> *)this,GrowsAtEnd,
               ((long)e - (long)b >> 4) * -0x5555555555555555,data,old);
    QGenericArrayOps<Symbol>::copyAppend
              ((QGenericArrayOps<Symbol> *)this,local_20,
               (Symbol *)(((long)e - (long)b) + (long)local_20));
    QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }